

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall FArchive::UserReadClass(FArchive *this,PClass **type)

{
  PClass *pPVar1;
  byte local_19;
  PClass **ppPStack_18;
  BYTE newclass;
  PClass **type_local;
  FArchive *this_local;
  
  ppPStack_18 = type;
  type_local = (PClass **)this;
  (*this->_vptr_FArchive[3])(this,&local_19,1);
  if (local_19 == 0) {
    pPVar1 = ReadStoredClass(this,DObject::RegistrationInfo.MyClass);
    *ppPStack_18 = pPVar1;
  }
  else if (local_19 == 1) {
    pPVar1 = ReadClass(this);
    *ppPStack_18 = pPVar1;
  }
  else if (local_19 == 2) {
    *ppPStack_18 = (PClass *)0x0;
  }
  else {
    I_Error("Unknown class type %d in archive.\n",(ulong)local_19);
  }
  return;
}

Assistant:

void FArchive::UserReadClass (PClass *&type)
{
	BYTE newclass;

	Read (&newclass, 1);
	switch (newclass)
	{
	case 0:
		type = ReadStoredClass (RUNTIME_CLASS(DObject));
		break;
	case 1:
		type = ReadClass ();
		break;
	case 2:
		type = NULL;
		break;
	default:
		I_Error ("Unknown class type %d in archive.\n", newclass);
		break;
	}
}